

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

int __thiscall
re2::RE2::ReverseProgramFanout
          (RE2 *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *histogram)

{
  int iVar1;
  Prog *prog;
  
  if (this->prog_ != (Prog *)0x0) {
    prog = ReverseProg(this);
    if (prog != (Prog *)0x0) {
      iVar1 = Fanout(prog,histogram);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int RE2::ReverseProgramFanout(std::map<int, int>* histogram) const {
  if (prog_ == NULL)
    return -1;
  Prog* prog = ReverseProg();
  if (prog == NULL)
    return -1;
  return Fanout(prog, histogram);
}